

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIUUIDValueImpl::~FIUUIDValueImpl(FIUUIDValueImpl *this)

{
  (this->super_FIUUIDValue).super_FIByteValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__008d4e88;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIByteValue::~FIByteValue((FIByteValue *)this);
  return;
}

Assistant:

inline FIUUIDValueImpl(std::vector<uint8_t> &&value_): strValueValid(false) { value = std::move(value_); }